

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O3

void Bmc_CexCarePropagateFwdOne(Gia_Man_t *p,Abc_Cex_t *pCex,int f,int fGrow)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  
  pVVar2 = p->vCis;
  uVar21 = pVVar2->nSize;
  uVar14 = uVar21 - p->nRegs;
  if ((fGrow & 2U) == 0) {
    if (0 < (int)uVar14) {
      uVar13 = 0;
      uVar11 = (ulong)uVar21;
      if ((int)uVar21 < 1) {
        uVar11 = uVar13;
      }
      do {
        if (uVar11 == uVar13) {
LAB_0051db9b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar9 = pVVar2->pArray[uVar13];
        if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_0051db5d;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        iVar20 = pCex->nPis * f;
        iVar17 = (int)uVar13 + iVar20;
        if (iVar17 < -1) {
LAB_0051dbba:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
        uVar21 = iVar20 + pCex->nRegs + (int)uVar13;
        p->pObjs[iVar9].Value =
             (uint)(((uint)(&pCex[1].iPo)[(int)uVar21 >> 5] >> (uVar21 & 0x1f) & 1) != 0) +
             iVar17 * 2 + 2;
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
    }
  }
  else if (0 < (int)uVar14) {
    uVar13 = 0;
    uVar11 = (ulong)uVar21;
    if ((int)uVar21 < 1) {
      uVar11 = uVar13;
    }
    iVar9 = -1;
    uVar19 = 0;
    do {
      if (uVar11 == uVar19) goto LAB_0051db9b;
      iVar17 = pVVar2->pArray[uVar19];
      if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_0051db5d;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar20 = pCex->nPis;
      if ((f + 1) * iVar20 + iVar9 < -1) goto LAB_0051dbba;
      uVar21 = iVar20 * f + pCex->nRegs + (int)uVar19;
      p->pObjs[iVar17].Value =
           (f * 2 + 2) * iVar20 +
           (uint)(((uint)(&pCex[1].iPo)[(int)uVar21 >> 5] >> (uVar21 & 0x1f) & 1) != 0) +
           (int)uVar13;
      uVar19 = uVar19 + 1;
      uVar13 = (ulong)((int)uVar13 - 2);
      iVar9 = iVar9 + -1;
    } while (uVar14 != uVar19);
  }
  uVar21 = p->nObjs;
  uVar11 = (ulong)uVar21;
  if ((0 < (int)uVar21) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    puVar6 = &p->pObjs->Value;
    do {
      uVar13 = *(ulong *)(puVar6 + -2);
      if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
        uVar14 = *(uint *)((long)puVar6 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
        if (((int)uVar14 < 0) ||
           (uVar15 = *(uint *)((long)puVar6 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar15 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        uVar18 = uVar14 >> 1;
        uVar7 = uVar15 >> 1;
        uVar22 = uVar14 & 1;
        uVar4 = (uint)(uVar13 >> 0x1d);
        uVar16 = uVar4 & 1;
        uVar15 = uVar15 & 1;
        uVar12 = (uint)(uVar13 >> 0x3d) & 1;
        if ((uVar22 == uVar16) || (uVar15 == uVar12)) {
          if (((uVar22 == uVar16) || (uVar8 = uVar7, uVar15 != uVar12)) &&
             ((uVar22 != uVar16 || (uVar8 = uVar18, uVar15 == uVar12)))) {
            if ((fGrow & 1U) == 0) goto LAB_0051dac0;
            goto LAB_0051da97;
          }
        }
        else if ((fGrow & 1U) == 0) {
LAB_0051da97:
          uVar8 = uVar7;
          if (uVar7 < uVar18) {
            uVar8 = uVar18;
          }
        }
        else {
LAB_0051dac0:
          uVar8 = uVar7;
          if (uVar18 < uVar7) {
            uVar8 = uVar18;
          }
        }
        *puVar6 = ((uVar15 ^ uVar12) & (uVar14 ^ uVar4 & 7)) + uVar8 * 2;
      }
      puVar6 = puVar6 + 3;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  lVar5 = (long)p->vCos->nSize;
  if (0 < lVar5) {
    piVar3 = p->vCos->pArray;
    lVar10 = 0;
    do {
      iVar9 = piVar3[lVar10];
      if (((long)iVar9 < 0) || ((int)uVar21 <= iVar9)) {
LAB_0051db5d:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar1 = p->pObjs + iVar9;
      if ((int)pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      pGVar1->Value =
           (uint)*(undefined8 *)pGVar1 >> 0x1d & 1 ^
           pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value;
      lVar10 = lVar10 + 1;
    } while (lVar5 != lVar10);
  }
  return;
}

Assistant:

void Bmc_CexCarePropagateFwdOne( Gia_Man_t * p, Abc_Cex_t * pCex, int f, int fGrow )
{
    Gia_Obj_t * pObj;
    int Prio, Prio0, Prio1;
    int i, Phase0, Phase1;
    if ( (fGrow & 2) )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Abc_Var2Lit( f * pCex->nPis + (pCex->nPis-1-i) + 1, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Abc_Var2Lit( f * pCex->nPis + i + 1, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        Prio0  = Abc_Lit2Var(Gia_ObjFanin0(pObj)->Value);
        Prio1  = Abc_Lit2Var(Gia_ObjFanin1(pObj)->Value);
        Phase0 = Abc_LitIsCompl(Gia_ObjFanin0(pObj)->Value) ^ Gia_ObjFaninC0(pObj);
        Phase1 = Abc_LitIsCompl(Gia_ObjFanin1(pObj)->Value) ^ Gia_ObjFaninC1(pObj);
        if ( Phase0 && Phase1 )
            Prio = (fGrow & 1) ? Abc_MinInt(Prio0, Prio1) : Abc_MaxInt(Prio0, Prio1);
        else if ( Phase0 && !Phase1 )
            Prio = Prio1;
        else if ( !Phase0 && Phase1 )
            Prio = Prio0;
        else // if ( !Phase0 && !Phase1 )
            Prio = (fGrow & 1) ? Abc_MaxInt(Prio0, Prio1) : Abc_MinInt(Prio0, Prio1);
        pObj->Value = Abc_Var2Lit( Prio, Phase0 & Phase1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Abc_LitNotCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
}